

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master.cpp
# Opt level: O3

void __thiscall miniros::master::Master::setupBindings(Master *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  RPCManager *pRVar2;
  string local_38;
  
  pRVar2 = (this->m_rpcManager).super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  paVar1 = &local_38.field_2;
  local_38._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"registerPublisher","");
  RPCManager::
  bindEx4<miniros::master::Master,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (pRVar2,&local_38,this,(offset_in_Master_to_subr)registerPublisher);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  pRVar2 = (this->m_rpcManager).super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_38._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"unregisterPublisher","");
  RPCManager::
  bindEx3<miniros::master::Master,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (pRVar2,&local_38,this,(offset_in_Master_to_subr)unregisterPublisher);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  pRVar2 = (this->m_rpcManager).super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_38._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"registerSubscriber","");
  RPCManager::
  bindEx4<miniros::master::Master,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (pRVar2,&local_38,this,(offset_in_Master_to_subr)registerSubscriber);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  pRVar2 = (this->m_rpcManager).super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_38._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"unregisterSubscriber","");
  RPCManager::
  bindEx3<miniros::master::Master,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (pRVar2,&local_38,this,(offset_in_Master_to_subr)unregisterSubscriber);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  pRVar2 = (this->m_rpcManager).super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_38._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"getPublishedTopics","");
  RPCManager::bindEx2<miniros::master::Master,std::__cxx11::string,std::__cxx11::string>
            (pRVar2,&local_38,this,(offset_in_Master_to_subr)getPublishedTopics);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  pRVar2 = (this->m_rpcManager).super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_38._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"getTopicTypes","");
  RPCManager::bindEx1<miniros::master::Master,std::__cxx11::string>
            (pRVar2,&local_38,this,(offset_in_Master_to_subr)getTopicTypes);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  pRVar2 = (this->m_rpcManager).super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_38._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"getSystemState","");
  RPCManager::bindEx1<miniros::master::Master,std::__cxx11::string>
            (pRVar2,&local_38,this,(offset_in_Master_to_subr)getSystemState);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  pRVar2 = (this->m_rpcManager).super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_38._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"lookupService","");
  RPCManager::bindEx2<miniros::master::Master,std::__cxx11::string,std::__cxx11::string>
            (pRVar2,&local_38,this,(offset_in_Master_to_subr)lookupService);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  pRVar2 = (this->m_rpcManager).super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_38._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"unregisterService","");
  RPCManager::
  bindEx3<miniros::master::Master,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (pRVar2,&local_38,this,(offset_in_Master_to_subr)unregisterService);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  pRVar2 = (this->m_rpcManager).super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_38._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"registerService","");
  RPCManager::
  bindEx4<miniros::master::Master,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (pRVar2,&local_38,this,(offset_in_Master_to_subr)registerService);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  pRVar2 = (this->m_rpcManager).super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_38._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"lookupNode","");
  RPCManager::bindEx2<miniros::master::Master,std::__cxx11::string,std::__cxx11::string>
            (pRVar2,&local_38,this,(offset_in_Master_to_subr)lookupNode);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  pRVar2 = (this->m_rpcManager).super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_38._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"hasParam","");
  RPCManager::bindEx2<miniros::master::Master,std::__cxx11::string,std::__cxx11::string>
            (pRVar2,&local_38,this,(offset_in_Master_to_subr)hasParam);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  pRVar2 = (this->m_rpcManager).super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_38._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"setParam","");
  RPCManager::
  bindEx3<miniros::master::Master,std::__cxx11::string,std::__cxx11::string,XmlRpc::XmlRpcValue>
            (pRVar2,&local_38,this,(offset_in_Master_to_subr)setParam);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  pRVar2 = (this->m_rpcManager).super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_38._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"getParam","");
  RPCManager::bindEx2<miniros::master::Master,std::__cxx11::string,std::__cxx11::string>
            (pRVar2,&local_38,this,(offset_in_Master_to_subr)getParam);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  pRVar2 = (this->m_rpcManager).super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_38._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"deleteParam","");
  RPCManager::bindEx2<miniros::master::Master,std::__cxx11::string,std::__cxx11::string>
            (pRVar2,&local_38,this,(offset_in_Master_to_subr)deleteParam);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  pRVar2 = (this->m_rpcManager).super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_38._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"searchParam","");
  RPCManager::bindEx2<miniros::master::Master,std::__cxx11::string,std::__cxx11::string>
            (pRVar2,&local_38,this,(offset_in_Master_to_subr)searchParam);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  pRVar2 = (this->m_rpcManager).super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_38._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"subscribeParam","");
  RPCManager::
  bindEx3<miniros::master::Master,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (pRVar2,&local_38,this,(offset_in_Master_to_subr)subscribeParam);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  pRVar2 = (this->m_rpcManager).super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_38._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"unsubscribeParam","");
  RPCManager::
  bindEx3<miniros::master::Master,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (pRVar2,&local_38,this,(offset_in_Master_to_subr)unsubscribeParam);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  pRVar2 = (this->m_rpcManager).super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_38._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"getParamNames","");
  RPCManager::bindEx1<miniros::master::Master,std::__cxx11::string>
            (pRVar2,&local_38,this,(offset_in_Master_to_subr)getParamNames);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Master::setupBindings()
{
  // Core master part.
  m_rpcManager->bindEx4("registerPublisher", this, &Master::registerPublisher);
  m_rpcManager->bindEx3("unregisterPublisher", this, &Master::unregisterPublisher);
  m_rpcManager->bindEx4("registerSubscriber", this, &Master::registerSubscriber);
  m_rpcManager->bindEx3("unregisterSubscriber", this, &Master::unregisterSubscriber);
  m_rpcManager->bindEx2("getPublishedTopics", this, &Master::getPublishedTopics);
  m_rpcManager->bindEx1("getTopicTypes", this, &Master::getTopicTypes);
  m_rpcManager->bindEx1("getSystemState", this, &Master::getSystemState);

  m_rpcManager->bindEx2("lookupService", this, &Master::lookupService);
  m_rpcManager->bindEx3("unregisterService", this, &Master::unregisterService);
  m_rpcManager->bindEx4("registerService", this, &Master::registerService);
  m_rpcManager->bindEx2("lookupNode", this, &Master::lookupNode);

  // Rosparam part.
  m_rpcManager->bindEx2("hasParam", this, &Master::hasParam);
  m_rpcManager->bindEx3("setParam", this, &Master::setParam);
  m_rpcManager->bindEx2("getParam", this, &Master::getParam);
  m_rpcManager->bindEx2("deleteParam", this, &Master::deleteParam);
  m_rpcManager->bindEx2("searchParam", this, &Master::searchParam);
  m_rpcManager->bindEx3("subscribeParam", this, &Master::subscribeParam);
  m_rpcManager->bindEx3("unsubscribeParam", this, &Master::unsubscribeParam);
  m_rpcManager->bindEx1("getParamNames", this, &Master::getParamNames);
}